

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,int value)

{
  type_conflict4 tVar1;
  ostream_iterator<char,_char,_std::char_traits<char>_> *this_00;
  ostream_iterator<char,_char,_std::char_traits<char>_> *this_01;
  uint32_t in_ESI;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_RDI;
  ostream_iterator<char,_char,_std::char_traits<char>_> *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  char *in_stack_ffffffffffffffa8;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  ostream_type *local_38;
  int in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  uint32_t local_10;
  
  tVar1 = internal::is_negative<int>(in_ESI);
  local_10 = in_ESI;
  if (tVar1) {
    local_10 = -in_ESI;
  }
  internal::count_digits(local_10);
  this_00 = reserve(in_RDI,(size_t)in_stack_ffffffffffffffa8);
  if (tVar1) {
    in_stack_ffffffffffffffdf = 0x2d;
    this_01 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(this_00,0);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(this_01);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              (&in_RDI->out_,in_stack_ffffffffffffffa8);
  }
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_48,this_00);
  internal::
  format_decimal<char,std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_int>
            ((ostream_iterator<char,_char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4
             ,in_stack_ffffffffffffffd0);
  this_00->_M_stream = local_38;
  this_00->_M_string = (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }